

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O2

String * __thiscall asl::Directory::name(String *__return_storage_ptr__,Directory *this)

{
  String SStack_28;
  
  Path::Path((Path *)&SStack_28,&this->_path);
  Path::name(__return_storage_ptr__,(Path *)&SStack_28);
  String::~String(&SStack_28);
  return __return_storage_ptr__;
}

Assistant:

String Directory::name() const
{
	return Path(_path).name();
}